

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bss_mem.c
# Opt level: O0

int mem_read(BIO *b,char *out,int outl)

{
  int in_EDX;
  void *in_RSI;
  BIO *in_RDI;
  BUF_MEM *bm;
  BIO_BUF_MEM *bbm;
  int ret;
  int local_2c;
  BIO_METHOD *local_28;
  int local_18;
  
  local_28 = (BIO_METHOD *)in_RDI->prev_bio->callback;
  if (((ulong)in_RDI->ptr & 0x200) != 0) {
    local_28 = in_RDI->prev_bio->method;
  }
  BIO_clear_flags(in_RDI,0xf);
  local_2c = in_EDX;
  if ((-1 < in_EDX) && (*(ulong *)local_28 < (ulong)(long)in_EDX)) {
    local_2c = (int)*(ulong *)local_28;
  }
  local_18 = local_2c;
  if ((in_RSI == (void *)0x0) || (local_2c < 1)) {
    if ((*(ulong *)local_28 == 0) && (local_18 = *(int *)&in_RDI->next_bio, local_18 != 0)) {
      BIO_set_flags(in_RDI,9);
    }
  }
  else {
    memcpy(in_RSI,local_28->name,(long)local_2c);
    *(ulong *)local_28 = *(ulong *)local_28 - (long)local_2c;
    local_28->bwrite = local_28->bwrite + -(long)local_2c;
    local_28->name = local_28->name + local_2c;
  }
  return local_18;
}

Assistant:

static int mem_read(BIO *b, char *out, int outl)
{
    int ret = -1;
    BIO_BUF_MEM *bbm = (BIO_BUF_MEM *)b->ptr;
    BUF_MEM *bm = bbm->readp;

    if (b->flags & BIO_FLAGS_MEM_RDONLY)
        bm = bbm->buf;
    BIO_clear_retry_flags(b);
    ret = (outl >= 0 && (size_t)outl > bm->length) ? (int)bm->length : outl;
    if ((out != NULL) && (ret > 0)) {
        memcpy(out, bm->data, ret);
        bm->length -= ret;
        bm->max -= ret;
        bm->data += ret;
    } else if (bm->length == 0) {
        ret = b->num;
        if (ret != 0)
            BIO_set_retry_read(b);
    }
    return ret;
}